

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

void do_cmd_change_name(void)

{
  bool bVar1;
  _Bool _Var2;
  ui_event uVar3;
  char local_4b8 [8];
  char fname [80];
  char buf [1024];
  char namebuf [32];
  _Bool more;
  char *p;
  wchar_t mode;
  ui_event ke;
  
  p._0_4_ = L'\0';
  bVar1 = true;
  screen_save();
  do {
    if (!bVar1) {
      screen_load();
      return;
    }
    display_player((wchar_t)p);
    Term_putstr(L'\x02',L'\x17',L'\xffffffff',L'\x01',
                "[\'c\' to change name, \'f\' to file, \'h\' to change mode, or ESC]");
    uVar3 = inkey_ex();
    p._4_4_ = uVar3.type;
    if ((p._4_4_ == EVT_KBRD) || (p._4_4_ == EVT_BUTTON)) {
      mode = uVar3.key.code;
      if (mode == L' ') goto LAB_00249eee;
      if (mode == L'c') {
        if ((arg_force_name & 1U) == 0) {
          memset(buf + 0x3f8,0,0x20);
          _Var2 = get_character_name(buf + 0x3f8,0x20);
          if (_Var2) {
            my_strcpy(player->full_name,buf + 0x3f8,0x20);
          }
        }
        else {
          msg("You are not allowed to change your name!");
        }
      }
      else if (mode == L'f') {
        player_safe_name(local_4b8,0x50,player->full_name,false);
        my_strcat(local_4b8,".txt",0x50);
        _Var2 = (*get_file)(local_4b8,fname + 0x48,0x400);
        if (_Var2) {
          _Var2 = dump_save(fname + 0x48);
          if (_Var2) {
            msg("Character dump successful.");
          }
          else {
            msg("Character dump failed!");
          }
        }
      }
      else if (mode == L'h') {
LAB_00249eee:
        p._0_4_ = ((wchar_t)p + L'\x01') % 2;
      }
      else {
        if (mode != L'l') {
          if (mode == L'\x81') goto LAB_00249eee;
          if (mode != L'\x82') {
            if (mode == L'\xe000') {
              bVar1 = false;
            }
            goto LAB_00249f5c;
          }
        }
        p._0_4_ = ((wchar_t)p + L'\xffffffff') % 2;
      }
    }
    else if (p._4_4_ == EVT_MOUSE) {
      mode._2_1_ = uVar3.key.code._2_1_;
      if (mode._2_1_ == '\x01') {
        p._0_4_ = ((wchar_t)p + L'\x01') % 2;
      }
      else if (mode._2_1_ == '\x02') {
        bVar1 = false;
      }
      else {
        p._0_4_ = ((wchar_t)p + L'\xffffffff') % 2;
      }
    }
LAB_00249f5c:
    event_signal(EVENT_MESSAGE_FLUSH);
  } while( true );
}

Assistant:

void do_cmd_change_name(void)
{
	ui_event ke;
	int mode = 0;

	const char *p;

	bool more = true;

	/* Prompt */
	p = "['c' to change name, 'f' to file, 'h' to change mode, or ESC]";

	/* Save screen */
	screen_save();

	/* Forever */
	while (more) {
		/* Display the player */
		display_player(mode);

		/* Prompt */
		Term_putstr(2, 23, -1, COLOUR_WHITE, p);

		/* Query */
		ke = inkey_ex();

		if ((ke.type == EVT_KBRD)||(ke.type == EVT_BUTTON)) {
			switch (ke.key.code) {
				case ESCAPE: more = false; break;
				case 'c': {
					if(arg_force_name)
						msg("You are not allowed to change your name!");
					else {
					char namebuf[32] = "";

					/* Set player name */
					if (get_character_name(namebuf, sizeof namebuf))
						my_strcpy(player->full_name, namebuf,
								  sizeof(player->full_name));
					}

					break;
				}

				case 'f': {
					char buf[1024];
					char fname[80];

					/* Get the filesystem-safe name and append .txt */
					player_safe_name(fname, sizeof(fname), player->full_name, false);
					my_strcat(fname, ".txt", sizeof(fname));

					if (get_file(fname, buf, sizeof buf)) {
						if (dump_save(buf))
							msg("Character dump successful.");
						else
							msg("Character dump failed!");
					}
					break;
				}
				
				case 'h':
				case ARROW_LEFT:
				case ' ':
					mode = (mode + 1) % INFO_SCREENS;
					break;

				case 'l':
				case ARROW_RIGHT:
					mode = (mode - 1) % INFO_SCREENS;
					break;
			}
		} else if (ke.type == EVT_MOUSE) {
			if (ke.mouse.button == 1) {
				/* Flip through the screens */			
				mode = (mode + 1) % INFO_SCREENS;
			} else if (ke.mouse.button == 2) {
				/* exit the screen */
				more = false;
			} else {
				/* Flip backwards through the screens */			
				mode = (mode - 1) % INFO_SCREENS;
			}
		}

		/* Flush messages */
		event_signal(EVENT_MESSAGE_FLUSH);
	}

	/* Load screen */
	screen_load();
}